

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O2

int arg_parse_list_helper(arg *arg,int *list,int n,char *err_msg)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  char *__format;
  ulong uVar4;
  ulong uVar5;
  char *endptr;
  
  pcVar3 = arg->val;
  if (err_msg != (char *)0x0) {
    *err_msg = '\0';
  }
  uVar4 = 0;
  uVar5 = 0;
  if (0 < n) {
    uVar5 = (ulong)(uint)n;
  }
  do {
    if (*pcVar3 == '\0') {
LAB_0041db9d:
      return (int)uVar4;
    }
    lVar2 = strtol(pcVar3,&endptr,10);
    if ((int)lVar2 != lVar2) {
      if (err_msg == (char *)0x0) {
LAB_0041db9b:
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        snprintf(err_msg,200,"Option %s: Value %ld out of range for signed int\n",arg->name,lVar2);
      }
      goto LAB_0041db9d;
    }
    if (uVar5 == uVar4) {
      if (err_msg == (char *)0x0) goto LAB_0041db9b;
      pcVar3 = arg->name;
      __format = "Option %s: List has more than %d entries\n";
      uVar5 = (ulong)(uint)n;
LAB_0041db92:
      uVar4 = 0;
      snprintf(err_msg,200,__format,pcVar3,uVar5);
      goto LAB_0041db9d;
    }
    cVar1 = *endptr;
    if (cVar1 != '\0') {
      if (cVar1 != ',') {
        if (err_msg == (char *)0x0) goto LAB_0041db9b;
        uVar5 = (ulong)(uint)(int)cVar1;
        pcVar3 = arg->name;
        __format = "Option %s: Bad list separator \'%c\'\n";
        goto LAB_0041db92;
      }
      endptr = endptr + 1;
    }
    list[uVar4] = (int)lVar2;
    uVar4 = uVar4 + 1;
    pcVar3 = endptr;
  } while( true );
}

Assistant:

int arg_parse_list_helper(const struct arg *arg, int *list, int n,
                          char *err_msg) {
  const char *ptr = arg->val;
  char *endptr;
  int i = 0;

  if (err_msg) err_msg[0] = '\0';

  while (ptr[0] != '\0') {
    long rawval = strtol(ptr, &endptr, 10);  // NOLINT
    if (rawval < INT_MIN || rawval > INT_MAX) {
      SET_ERR_STRING("Option %s: Value %ld out of range for signed int\n",
                     arg->name, rawval);
      return 0;
    } else if (i >= n) {
      SET_ERR_STRING("Option %s: List has more than %d entries\n", arg->name,
                     n);
      return 0;
    } else if (*endptr == ',') {
      endptr++;
    } else if (*endptr != '\0') {
      SET_ERR_STRING("Option %s: Bad list separator '%c'\n", arg->name,
                     *endptr);
      return 0;
    }
    list[i++] = (int)rawval;
    ptr = endptr;
  }
  return i;
}